

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.c
# Opt level: O2

int compressor_segment_mix(mixed_segment *segment)

{
  int iVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float local_ec;
  float local_e8;
  float local_e4;
  int local_e0;
  uint32_t samples;
  float local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  uint local_a8;
  int local_a4;
  uint local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  undefined1 local_68 [16];
  float *output;
  float *input;
  undefined1 local_48 [16];
  
  puVar2 = (undefined8 *)segment->data;
  local_e4 = *(float *)(puVar2 + 2);
  local_6c = *(float *)((long)puVar2 + 0x14);
  local_80 = *(float *)(puVar2 + 3);
  local_84 = *(float *)((long)puVar2 + 0x1c);
  local_70 = *(float *)(puVar2 + 4);
  local_88 = *(float *)((long)puVar2 + 0x24);
  local_8c = *(float *)(puVar2 + 5);
  local_ac = *(float *)((long)puVar2 + 0x2c);
  local_90 = *(float *)(puVar2 + 6);
  local_78 = *(float *)(puVar2 + 7);
  local_94 = *(float *)((long)puVar2 + 0x3c);
  local_98 = *(float *)(puVar2 + 8);
  local_9c = *(float *)((long)puVar2 + 0x44);
  local_b0 = *(float *)((long)puVar2 + 0x4c);
  local_b4 = *(float *)(puVar2 + 10);
  iVar1 = *(int *)(puVar2 + 0xd);
  iVar4 = *(int *)((long)puVar2 + 0x6c);
  iVar3 = *(int *)(puVar2 + 0xe);
  local_74 = *(float *)((long)puVar2 + 0x34) * *(float *)(puVar2 + 9);
  local_b8 = *(float *)((long)puVar2 + 0x54);
  local_bc = *(float *)(puVar2 + 0xb);
  local_68 = ZEXT416(*(uint *)((long)puVar2 + 0x5c));
  local_e8 = *(float *)(puVar2 + 0xc);
  local_ec = *(float *)((long)puVar2 + 100);
  samples = 0xffffffff;
  mixed_buffer_request_read(&input,&samples,(mixed_buffer *)*puVar2);
  mixed_buffer_request_write(&output,&samples,(mixed_buffer *)puVar2[1]);
  local_a8 = samples >> 5;
  samples = samples & 0xffffffe0;
  uVar6 = 0;
  iVar5 = 0x20;
  local_e0 = 0;
  while( true ) {
    if (uVar6 == local_a8) break;
    if (0x7f7fffff < (uint)ABS((float)local_68._0_4_)) {
      local_68._0_4_ = 1.0;
      local_68._4_4_ = 0;
      local_68._8_4_ = 0;
      local_68._12_4_ = 0;
    }
    local_7c = asinf((float)local_68._0_4_);
    local_7c = local_7c * 0.63661975;
    fVar8 = lin2db(local_e8 / local_7c);
    local_a0 = uVar6;
    if (0.0 <= fVar8) {
      uStack_d4 = extraout_XMM0_Db;
      uStack_d0 = extraout_XMM0_Dc;
      uStack_cc = extraout_XMM0_Dd;
      if (0x7f7fffff < (uint)ABS(fVar8)) {
        fVar8 = 1.0;
        uStack_d4 = 0;
        uStack_d0 = 0;
        uStack_cc = 0;
      }
      fVar9 = fVar8;
      if (fVar8 <= local_ec) {
        fVar9 = local_ec;
      }
      local_d8 = (float)(~-(uint)(local_ec == -1.0) & (uint)fVar9 |
                        -(uint)(local_ec == -1.0) & (uint)fVar8);
      fVar8 = 0.5;
      if (0.5 <= local_d8) {
        fVar8 = local_d8;
      }
      fVar8 = powf(0.25 / fVar8,local_ac);
      local_48 = ZEXT416((uint)(1.0 - fVar8));
      local_ec = local_d8;
    }
    else {
      if (0x7f7fffff < (uint)ABS(fVar8)) {
        fVar8 = -1.0;
      }
      fVar9 = -12.0;
      if (-12.0 <= fVar8) {
        fVar9 = fVar8;
      }
      fVar8 = (fVar9 + 12.0) * 0.25;
      local_48._0_4_ =
           powf(10.0,(5.0 / (fVar8 * local_b8 +
                             local_b0 * fVar8 * fVar8 * fVar8 + fVar8 * fVar8 * local_b4 + local_bc)
                     ) * 0.05);
      local_48._4_4_ = extraout_XMM0_Db_00;
      local_48._8_4_ = extraout_XMM0_Dc_00;
      local_48._12_4_ = extraout_XMM0_Dd_00;
      local_ec = -1.0;
    }
    local_a4 = iVar5;
    for (lVar7 = (long)local_e0; iVar5 != lVar7; lVar7 = lVar7 + 1) {
      fVar9 = input[lVar7] * local_70;
      *(float *)((long)puVar2 + (long)iVar4 * 4 + 0x74) = fVar9;
      fVar8 = -fVar9;
      if (-fVar9 <= fVar9) {
        fVar8 = fVar9;
      }
      fVar9 = 1.0;
      if (0.0001 <= fVar8) {
        uStack_d4 = 0x80000000;
        uStack_d0 = 0x80000000;
        uStack_cc = 0x80000000;
        local_d8 = fVar8;
        fVar9 = compcurve(fVar8,local_94,local_8c,local_88,local_9c,local_80,local_84,local_98);
        fVar9 = fVar9 / local_d8;
      }
      fVar8 = 1.0;
      if ((float)local_68._0_4_ < fVar9) {
        local_d8 = fVar9;
        fVar9 = lin2db(fVar9);
        fVar8 = -2.0;
        if (fVar9 <= -2.0) {
          fVar8 = fVar9;
        }
        fVar8 = powf(10.0,fVar8 * local_90 * -0.05);
        fVar8 = fVar8 + -1.0;
        fVar9 = local_d8;
      }
      local_68._0_4_ = (fVar9 - (float)local_68._0_4_) * fVar8 + (float)local_68._0_4_;
      fVar8 = (float)local_68._0_4_;
      if (0x7f7fffff < (uint)ABS((float)local_68._0_4_)) {
        fVar8 = 1.0;
      }
      if (1.0 <= (float)local_48._0_4_) {
        local_e8 = local_e8 * (float)local_48._0_4_;
        if (1.0 < local_e8) {
          local_e8 = 1.0;
        }
      }
      else {
        local_e8 = local_e8 + (local_7c - local_e8) * (float)local_48._0_4_;
      }
      local_68 = ZEXT416(~-(uint)((float)local_68._0_4_ <= 1.0) & 0x3f800000 |
                         (uint)fVar8 & -(uint)((float)local_68._0_4_ <= 1.0));
      fVar8 = sinf(local_e8 * 1.5707964);
      local_d8 = local_74 * fVar8 + local_78;
      fVar8 = lin2db(fVar8);
      local_e4 = (float)(-(uint)(fVar8 < local_e4) & (uint)fVar8 |
                        ~-(uint)(fVar8 < local_e4) &
                        (uint)((fVar8 - local_e4) * local_6c + local_e4));
      output[lVar7] = local_d8 * *(float *)((long)puVar2 + (long)iVar3 * 4 + 0x74);
      iVar3 = (iVar3 + 1) % iVar1;
      iVar4 = (iVar4 + 1) % iVar1;
    }
    uVar6 = local_a0 + 1;
    iVar5 = local_a4 + 0x20;
    local_e0 = local_e0 + 0x20;
  }
  mixed_buffer_finish_write(samples,(mixed_buffer *)puVar2[1]);
  mixed_buffer_finish_read(samples,(mixed_buffer *)*puVar2);
  *(float *)(puVar2 + 2) = local_e4;
  *(undefined4 *)((long)puVar2 + 0x5c) = local_68._0_4_;
  *(float *)(puVar2 + 0xc) = local_e8;
  *(float *)((long)puVar2 + 100) = local_ec;
  *(int *)((long)puVar2 + 0x6c) = iVar4;
  *(int *)(puVar2 + 0xe) = iVar3;
  return 1;
}

Assistant:

VECTORIZE int compressor_segment_mix(struct mixed_segment *segment){
  struct compressor_segment_data *data = (struct compressor_segment_data *)segment->data;

  float metergain            = data->metergain;
  float meterrelease         = data->meterrelease;
  float threshold            = data->threshold;
  float knee                 = data->knee;
  float linearpregain        = data->linearpregain;
  float linearthreshold      = data->linearthreshold;
  float slope                = data->slope;
  float attacksamplesinv     = data->attacksamplesinv;
  float satreleasesamplesinv = data->satreleasesamplesinv;
  float wet                  = data->wet;
  float dry                  = data->dry;
  float k                    = data->k;
  float kneedboffset         = data->kneedboffset;
  float linearthresholdknee  = data->linearthresholdknee;
  float mastergain           = data->mastergain;
  float a                    = data->a;
  float b                    = data->b;
  float c                    = data->c;
  float d                    = data->d;
  float detectoravg          = data->detectoravg;
  float compgain             = data->compgain;
  float maxcompdiffdb        = data->maxcompdiffdb;
  int delaybufsize           = data->delaybufsize;
  int delaywritepos          = data->delaywritepos;
  int delayreadpos           = data->delayreadpos;
  float *delaybuf            = data->delaybuf;

  int samplesperchunk = MIXED_COMPRESSOR_SAMPLES_PER_UPDATE;
  float ang90 = (float)M_PI * 0.5f;
  float ang90inv = 2.0f / (float)M_PI;
  int samplepos = 0;
  float spacingdb = MIXED_COMPRESSOR_SPACING;

  uint32_t samples = UINT32_MAX;
  float *input, *output;
  mixed_buffer_request_read(&input, &samples, data->in);
  mixed_buffer_request_write(&output, &samples, data->out);
  
  int chunks = samples / samplesperchunk;
  samples = chunks * samplesperchunk;

  for (int ch = 0; ch < chunks; ch++){
    detectoravg = fixf(detectoravg, 1.0f);
    float desiredgain = detectoravg;
    float scaleddesiredgain = asinf(desiredgain) * ang90inv;
    float compdiffdb = lin2db(compgain / scaleddesiredgain);

    // calculate envelope rate based on whether we're attacking or releasing
    float enveloperate;
    if (compdiffdb < 0.0f){ // compgain < scaleddesiredgain, so we're releasing
      compdiffdb = fixf(compdiffdb, -1.0f);
      maxcompdiffdb = -1; // reset for a future attack mode
      // apply the adaptive release curve
      // scale compdiffdb between 0-3
      float x = (clampf(compdiffdb, -12.0f, 0.0f) + 12.0f) * 0.25f;
      float releasesamples = adaptivereleasecurve(x, a, b, c, d);
      enveloperate = db2lin(spacingdb / releasesamples);
    }
    else{ // compresorgain > scaleddesiredgain, so we're attacking
      compdiffdb = fixf(compdiffdb, 1.0f);
      if (maxcompdiffdb == -1 || maxcompdiffdb < compdiffdb)
        maxcompdiffdb = compdiffdb;
      float attenuate = maxcompdiffdb;
      if (attenuate < 0.5f)
        attenuate = 0.5f;
      enveloperate = 1.0f - powf(0.25f / attenuate, attacksamplesinv);
    }

    // process the chunk
    for (int chi = 0; chi < samplesperchunk; chi++, samplepos++,
           delayreadpos = (delayreadpos + 1) % delaybufsize,
           delaywritepos = (delaywritepos + 1) % delaybufsize){

      float inputL = input[samplepos] * linearpregain;
      delaybuf[delaywritepos] = inputL;

      inputL = absf(inputL);

      float attenuation;
      if (inputL < 0.0001f)
        attenuation = 1.0f;
      else{
        float inputcomp = compcurve(inputL, k, slope, linearthreshold, linearthresholdknee, threshold, knee, kneedboffset);
        attenuation = inputcomp / inputL;
      }

      float rate;
      if (attenuation > detectoravg){ // if releasing
        float attenuationdb = -lin2db(attenuation);
        if (attenuationdb < 2.0f)
          attenuationdb = 2.0f;
        float dbpersample = attenuationdb * satreleasesamplesinv;
        rate = db2lin(dbpersample) - 1.0f;
      }
      else
        rate = 1.0f;

      detectoravg += (attenuation - detectoravg) * rate;
      if (detectoravg > 1.0f)
        detectoravg = 1.0f;
      detectoravg = fixf(detectoravg, 1.0f);

      if (enveloperate < 1) // attack, reduce gain
        compgain += (scaleddesiredgain - compgain) * enveloperate;
      else{ // release, increase gain
        compgain *= enveloperate;
        if (compgain > 1.0f)
          compgain = 1.0f;
      }

      // the final gain value!
      float premixgain = sinf(ang90 * compgain);
      float gain = dry + wet * mastergain * premixgain;

      // calculate metering (not used in core algo, but used to output a meter if desired)
      float premixgaindb = lin2db(premixgain);
      if (premixgaindb < metergain)
        metergain = premixgaindb; // spike immediately
      else
        metergain += (premixgaindb - metergain) * meterrelease; // fall slowly

      // apply the gain
      output[samplepos] = delaybuf[delayreadpos] * gain;
    }
  }

  mixed_buffer_finish_write(samples, data->out);
  mixed_buffer_finish_read(samples, data->in);

  data->metergain     = metergain;
  data->detectoravg   = detectoravg;
  data->compgain      = compgain;
  data->maxcompdiffdb = maxcompdiffdb;
  data->delaywritepos = delaywritepos;
  data->delayreadpos  = delayreadpos;
  
  return 1;
}